

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearPosition.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearPosition::Update
          (ChLinkMotorLinearPosition *this,double mytime,bool update_assets)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  
  ChLinkMotorLinear::Update(&this->super_ChLinkMotorLinear,mytime,update_assets);
  dVar1 = (this->super_ChLinkMotorLinear).mpos;
  (*((this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  dVar2 = *(double *)&(this->super_ChLinkMotorLinear).field_0x278;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                      &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.C,0
                     );
  *pSVar3 = (dVar1 - mytime) - dVar2;
  return;
}

Assistant:

void ChLinkMotorLinearPosition::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorLinear::Update(mytime, update_assets);

    // Add the time-dependent term in residual C as
    //   C = d_error - d_setpoint - d_offset
    // with d_error = x_pos_A- x_pos_B, and d_setpoint = x(t)
    C(0) = this->mpos - m_func->Get_y(mytime) - this->pos_offset;
}